

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O2

int __thiscall axl::io::MappedFile::open(MappedFile *this,char *__file,int __oflag,...)

{
  int iVar1;
  
  close(this,(int)__file);
  iVar1 = File::open(&this->m_file,__file,__oflag);
  if ((char)iVar1 != '\0') {
    this->m_fileFlags = __oflag;
  }
  return iVar1;
}

Assistant:

bool
MappedFile::open(
	const sl::StringRef& fileName,
	uint_t flags
) {
	close();

	bool result = m_file.open(fileName, flags);
	if (!result)
		return false;

	m_fileFlags = flags;
	return true;
}